

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O3

int fy_document_vdiag(fy_document *fyd,uint flags,char *file,int line,char *func,char *fmt,
                     __va_list_tag *ap)

{
  fy_parse_cfg_flags fVar1;
  int iVar2;
  fy_diag_ctx local_60;
  
  iVar2 = -1;
  if ((fmt != (char *)0x0 && fyd != (fy_document *)0x0) && (fyd->diag != (fy_diag *)0x0)) {
    fVar1 = fy_document_get_cfg_flags(fyd);
    local_60.level = flags & 0xf;
    iVar2 = 0;
    if (((fVar1 >> 0xc & 0xf) <= local_60.level) &&
       (local_60.module = flags >> 4 & (FYEM_MAX|FYEM_SYSTEM),
       (byte)((byte)(1 << (sbyte)local_60.module) & (byte)(fVar1 >> 4)) != 0)) {
      local_60.file = (char *)0x0;
      local_60._28_4_ = 0;
      local_60.source_line = line;
      local_60.line = -1;
      local_60.column = -1;
      local_60.source_func = func;
      local_60.source_file = file;
      iVar2 = fy_vdiag(fyd->diag,&local_60,fmt,ap);
    }
  }
  return iVar2;
}

Assistant:

int fy_document_vdiag(struct fy_document *fyd, unsigned int flags,
                      const char *file, int line, const char *func,
                      const char *fmt, va_list ap) {
    struct fy_diag_ctx fydc;
    unsigned int pflags;
    int fydc_level, fyd_level, fydc_module;
    unsigned int fyd_module_mask;
    int rc;

    if (!fyd || !fmt || !fyd->diag)
        return -1;

    pflags = fy_document_get_cfg_flags(fyd);

    /* perform the enable tests early to avoid the overhead */
    fydc_level = (flags & FYDF_LEVEL_MASK) >> FYDF_LEVEL_SHIFT;
    fyd_level = (pflags >> FYPCF_DEBUG_LEVEL_SHIFT) & FYPCF_DEBUG_LEVEL_MASK;

    if (fydc_level < fyd_level)
        return 0;

    fydc_module = (flags & FYDF_MODULE_MASK) >> FYDF_MODULE_SHIFT;
    fyd_module_mask = (pflags >> FYPCF_MODULE_SHIFT) & FYPCF_MODULE_MASK;

    if (!(fyd_module_mask & FY_BIT(fydc_module)))
        return 0;

    /* fill in fy_diag_ctx */
    memset(&fydc, 0, sizeof(fydc));

    fydc.level = fydc_level;
    fydc.module = fydc_module;
    fydc.source_file = file;
    fydc.source_line = line;
    fydc.source_func = func;
    fydc.line = -1;
    fydc.column = -1;

    rc = fy_vdiag(fyd->diag, &fydc, fmt, ap);

    return rc;
}